

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O1

CURLMcode Curl_pipeline_set_server_blacklist(char **servers,curl_llist *list)

{
  size_t sVar1;
  curl_llist_element *ne;
  
  if (list->size != 0) {
    Curl_llist_destroy(list,(void *)0x0);
  }
  if (servers != (char **)0x0) {
    Curl_llist_init(list,server_blacklist_llist_dtor);
    for (; *servers != (char *)0x0; servers = servers + 1) {
      sVar1 = strlen(*servers);
      ne = (curl_llist_element *)(*Curl_cmalloc)(sVar1 + 0x20);
      if (ne == (curl_llist_element *)0x0) {
        Curl_llist_destroy(list,(void *)0x0);
        return CURLM_OUT_OF_MEMORY;
      }
      strcpy((char *)(ne + 1),*servers);
      Curl_llist_insert_next(list,list->tail,ne + 1,ne);
    }
  }
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_pipeline_set_server_blacklist(char **servers,
                                             struct curl_llist *list)
{
  /* Free the old list */
  if(list->size)
    Curl_llist_destroy(list, NULL);

  if(servers) {
    Curl_llist_init(list, (curl_llist_dtor) server_blacklist_llist_dtor);

    /* Parse the URLs and populate the list */
    while(*servers) {
      struct blacklist_node *n;
      size_t len = strlen(*servers);

      n = malloc(sizeof(struct blacklist_node) + len);
      if(!n) {
        Curl_llist_destroy(list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }
      strcpy(n->server_name, *servers);

      Curl_llist_insert_next(list, list->tail, n->server_name,
                             &n->list);
      servers++;
    }
  }


  return CURLM_OK;
}